

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasdreamOptimizationTests.cpp
# Opt level: O1

bool TasOptimization::testParticleSwarm(bool verbose)

{
  function<double_(const_std::vector<double,_std::allocator<double>_>_&)> *this;
  bool bVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  undefined7 in_register_00000039;
  vector<double,_std::allocator<double>_> upper;
  vector<double,_std::allocator<double>_> lower;
  ObjectiveFunction shc;
  ObjectiveFunction l1;
  ObjectiveFunctionSingle shc_single;
  ObjectiveFunctionSingle l1_single;
  ParticleSwarmState state;
  vector<double,_std::allocator<double>_> local_558;
  vector<double,_std::allocator<double>_> local_538;
  undefined4 local_51c;
  _Any_data local_518;
  code *local_508;
  _Any_data local_4f8;
  code *local_4e8;
  _Any_data local_4d8;
  code *local_4c8;
  _Any_data local_4b8;
  code *local_4a8;
  _Any_data local_498;
  code *local_488;
  _Any_data local_478;
  code *local_468;
  _Any_data local_458;
  code *local_448;
  _Any_data local_438;
  code *local_428;
  code *local_418;
  undefined8 uStack_410;
  code *local_408;
  code *pcStack_400;
  _Any_data local_3f8;
  code *local_3e8;
  code *local_3e0;
  code *local_3d8;
  undefined8 uStack_3d0;
  code *local_3c8;
  code *pcStack_3c0;
  _Any_data local_3b8;
  code *local_3a8;
  code *local_3a0;
  undefined1 local_390 [24];
  pointer local_378;
  undefined1 local_2b8 [8];
  function<double_(const_std::vector<double,_std::allocator<double>_>_&)> local_2b0 [6];
  ParticleSwarmState local_1e0;
  ParticleSwarmState local_108;
  
  local_538.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_538.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_538.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_538.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x30);
  local_538.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_538.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 6;
  lVar3 = 0;
  do {
    *(undefined8 *)
     ((long)local_538.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar3) = 0xc014000000000000;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x30);
  local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_538.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_538.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x30);
  local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 6;
  lVar3 = 0;
  do {
    *(undefined8 *)
     ((long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar3) = 0x4000000000000000;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x30);
  local_51c = (undefined4)CONCAT71(in_register_00000039,verbose);
  local_3b8._M_unused._M_object = (void *)0x0;
  local_3b8._8_8_ = 0;
  local_3a0 = std::
              _Function_handler<double_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:169:13)>
              ::_M_invoke;
  local_3a8 = std::
              _Function_handler<double_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:169:13)>
              ::_M_manager;
  local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  std::function<double_(const_std::vector<double,_std::allocator<double>_>_&)>::function
            ((function<double_(const_std::vector<double,_std::allocator<double>_>_&)> *)&local_458,
             (function<double_(const_std::vector<double,_std::allocator<double>_>_&)> *)&local_3b8);
  this = (function<double_(const_std::vector<double,_std::allocator<double>_>_&)> *)(local_390 + 8);
  local_390._0_4_ = 6;
  std::function<double_(const_std::vector<double,_std::allocator<double>_>_&)>::function
            (this,(function<double_(const_std::vector<double,_std::allocator<double>_>_&)> *)
                  &local_458);
  std::
  function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
  ::
  function<TasOptimization::makeObjectiveFunction(int,std::function<double(std::vector<double,std::allocator<double>>const&)>)::_lambda(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)_1_,void>
            ((function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
              *)local_438._M_pod_data,(anon_class_40_2_4528a0b4 *)local_390);
  if (local_378 != (pointer)0x0) {
    (*(code *)local_378)(this,this,3);
  }
  if (local_448 != (code *)0x0) {
    (*local_448)(&local_458,&local_458,__destroy_functor);
  }
  TasOptimization::ParticleSwarmState::ParticleSwarmState((ParticleSwarmState *)local_390,6,100);
  uStack_3d0 = 0;
  local_3d8 = TasDREAM::tsgCoreUniform01;
  pcStack_3c0 = std::_Function_handler<double_(),_double_(*)()>::_M_invoke;
  local_3c8 = std::_Function_handler<double_(),_double_(*)()>::_M_manager;
  TasOptimization::ParticleSwarmState::initializeParticlesInsideBox(local_390,&local_538,&local_558)
  ;
  if (local_3c8 != (code *)0x0) {
    (*local_3c8)(&local_3d8,&local_3d8,3);
  }
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::function((function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
              *)&local_478,
             (function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
              *)&local_438);
  ParticleSwarmState::ParticleSwarmState(&local_108,(ParticleSwarmState *)local_390);
  TasDREAM::hypercube((DreamDomain *)&local_498,&local_538,&local_558);
  bVar1 = testParticleSwarmSingle
                    ((ObjectiveFunction *)&local_478,&local_108,(DreamDomain *)&local_498,300,0.0);
  if (local_488 != (code *)0x0) {
    (*local_488)(&local_498,&local_498,__destroy_functor);
  }
  ParticleSwarmState::~ParticleSwarmState(&local_108);
  if (local_468 != (code *)0x0) {
    (*local_468)(&local_478,&local_478,__destroy_functor);
  }
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ERROR: failed l1 example for Particle Swarm optimization.\n",
               0x3a);
  }
  local_2b8[0] = false;
  local_2b8[1] = false;
  local_2b8[2] = false;
  local_2b8[3] = false;
  local_2b8._4_4_ = -0x3ff80000;
  local_2b0[0].super__Function_base._M_functor._M_unused._M_member_pointer = 0xc000000000000000;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&local_538,local_2b8);
  local_2b8[0] = false;
  local_2b8[1] = false;
  local_2b8[2] = false;
  local_2b8[3] = false;
  local_2b8._4_4_ = 0x40080000;
  local_2b0[0].super__Function_base._M_functor._M_unused._M_member_pointer = 0x4000000000000000;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&local_558,local_2b8);
  local_3f8._M_unused._M_object = (void *)0x0;
  local_3f8._8_8_ = 0;
  local_3e0 = std::
              _Function_handler<double_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:187:13)>
              ::_M_invoke;
  local_3e8 = std::
              _Function_handler<double_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:187:13)>
              ::_M_manager;
  std::function<double_(const_std::vector<double,_std::allocator<double>_>_&)>::function
            ((function<double_(const_std::vector<double,_std::allocator<double>_>_&)> *)&local_4d8,
             (function<double_(const_std::vector<double,_std::allocator<double>_>_&)> *)&local_3f8);
  local_2b8._0_4_ = 2;
  std::function<double_(const_std::vector<double,_std::allocator<double>_>_&)>::function
            (local_2b0,
             (function<double_(const_std::vector<double,_std::allocator<double>_>_&)> *)&local_4d8);
  std::
  function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
  ::
  function<TasOptimization::makeObjectiveFunction(int,std::function<double(std::vector<double,std::allocator<double>>const&)>)::_lambda(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)_1_,void>
            ((function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
              *)local_4b8._M_pod_data,(anon_class_40_2_4528a0b4 *)local_2b8);
  if ((pointer)local_2b0[0].super__Function_base._M_manager != (pointer)0x0) {
    (*local_2b0[0].super__Function_base._M_manager)(local_2b0,local_2b0,3);
  }
  if (local_4c8 != (code *)0x0) {
    (*local_4c8)(&local_4d8,&local_4d8,__destroy_functor);
  }
  TasOptimization::ParticleSwarmState::ParticleSwarmState((ParticleSwarmState *)local_2b8,2,0x32);
  ParticleSwarmState::operator=((ParticleSwarmState *)local_390,(ParticleSwarmState *)local_2b8);
  ParticleSwarmState::~ParticleSwarmState((ParticleSwarmState *)local_2b8);
  uStack_410 = 0;
  local_418 = TasDREAM::tsgCoreUniform01;
  pcStack_400 = std::_Function_handler<double_(),_double_(*)()>::_M_invoke;
  local_408 = std::_Function_handler<double_(),_double_(*)()>::_M_manager;
  TasOptimization::ParticleSwarmState::initializeParticlesInsideBox
            ((ParticleSwarmState *)local_390,&local_538,&local_558);
  if (local_408 != (code *)0x0) {
    (*local_408)(&local_418,&local_418,3);
  }
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::function((function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
              *)&local_4f8,
             (function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
              *)&local_4b8);
  ParticleSwarmState::ParticleSwarmState(&local_1e0,(ParticleSwarmState *)local_390);
  TasDREAM::hypercube((DreamDomain *)&local_518,&local_538,&local_558);
  bVar2 = testParticleSwarmSingle
                    ((ObjectiveFunction *)&local_4f8,&local_1e0,(DreamDomain *)&local_518,100,
                     -1.031628453489877);
  if (local_508 != (code *)0x0) {
    (*local_508)(&local_518,&local_518,__destroy_functor);
  }
  ParticleSwarmState::~ParticleSwarmState(&local_1e0);
  if (local_4e8 != (code *)0x0) {
    (*local_4e8)(&local_4f8,&local_4f8,__destroy_functor);
  }
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ERROR: failed l1 example for Particle Swarm optimization.\n",
               0x3a);
  }
  if (((!bVar1 || !bVar2) | (byte)local_51c) == 1) {
    *(undefined8 *)(&TasDREAM::LikelihoodGaussIsotropic::vtable + *(long *)(std::cout + -0x18)) =
         0x14;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Particle Swarm",0xe);
    *(undefined8 *)(&TasDREAM::LikelihoodGaussIsotropic::vtable + *(long *)(std::cout + -0x18)) =
         0x1e;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Algorithm Unit Tests",0x14);
    *(undefined8 *)(&TasDREAM::LikelihoodGaussIsotropic::vtable + *(long *)(std::cout + -0x18)) =
         0xf;
    pcVar4 = "FAIL";
    if (bVar1 && bVar2) {
      pcVar4 = "Pass";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
  }
  if (local_4a8 != (code *)0x0) {
    (*local_4a8)(&local_4b8,&local_4b8,__destroy_functor);
  }
  if (local_3e8 != (code *)0x0) {
    (*local_3e8)(&local_3f8,&local_3f8,__destroy_functor);
  }
  ParticleSwarmState::~ParticleSwarmState((ParticleSwarmState *)local_390);
  if (local_428 != (code *)0x0) {
    (*local_428)(&local_438,&local_438,__destroy_functor);
  }
  if (local_3a8 != (code *)0x0) {
    (*local_3a8)(&local_3b8,&local_3b8,__destroy_functor);
  }
  if (local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_538.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_538.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_538.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_538.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar1 && bVar2;
}

Assistant:

bool testParticleSwarm(bool verbose) {
    test_result test;

    // l1 norm over the domain [-5, 2] ^ 6.
    int num_dimensions = 6;
    int num_particles = 100;
    int iterations = 300;
    std::vector<double> lower(num_dimensions, -5.0);
    std::vector<double> upper(num_dimensions, 2.0);
    TasOptimization::ObjectiveFunctionSingle l1_single =
            [](const std::vector<double> &x)->double {
                double sum = 0;
                for (auto xi : x) sum += std::fabs(xi);
                return sum;
            };
    TasOptimization::ObjectiveFunction l1 = TasOptimization::makeObjectiveFunction(num_dimensions, l1_single);
    TasOptimization::ParticleSwarmState state(num_dimensions, num_particles);
    state.initializeParticlesInsideBox(lower, upper);
    test.tassert( testParticleSwarmSingle(l1, state, TasDREAM::hypercube(lower, upper), iterations, 0) );
    if (test.failed_last()) std::cout << "ERROR: failed l1 example for Particle Swarm optimization.\n";

    // Six hump-camel function over the domain [-3, 3] x [-2, 2].
    num_dimensions = 2;
    num_particles = 50;
    iterations = 100;
    lower = {-3.0, -2.0};
    upper = {3.0, 2.0};
    TasOptimization::ObjectiveFunctionSingle shc_single =
            [](const std::vector<double> &x)->double {
                return (4.0 - 2.1 * x[0]*x[0] + x[0]*x[0]*x[0]*x[0] / 3.0) * x[0]*x[0] +
                        x[0] * x[1] +
                        (-4.0 + 4.0 * x[1]*x[1]) * x[1]*x[1];};
    TasOptimization::ObjectiveFunction shc = TasOptimization::makeObjectiveFunction(num_dimensions, shc_single);
    state = ParticleSwarmState(num_dimensions, num_particles);
    state.initializeParticlesInsideBox(lower, upper);
    test.tassert( testParticleSwarmSingle(shc, state, TasDREAM::hypercube(lower, upper), iterations, -1.031628453489877) );
    if (test.failed_last()) std::cout << "ERROR: failed l1 example for Particle Swarm optimization.\n";

    // Reporting.
    if (test.failed_any() or verbose) reportPassFail(test.success(), "Particle Swarm", "Algorithm Unit Tests");
    return test.success();
}